

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbm-xs.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  reference pvVar1;
  ulong local_270;
  size_t i;
  kbm loaded_kbm;
  ifstream local_220 [8];
  ifstream test_kbm;
  char **param_1_local;
  int param_0_local;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,"kbm/12-tet-xs.kbm",8);
  scala::read_kbm((kbm *)&i,local_220);
  if (loaded_kbm.reference_frequency._0_4_ != 0xc) {
    __assert_fail("loaded_kbm.map_size == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x15,"int main(int, char **)");
  }
  if (loaded_kbm.reference_frequency._4_4_ != 0) {
    __assert_fail("loaded_kbm.first_note == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x16,"int main(int, char **)");
  }
  if (loaded_kbm.map_size != 0x7f) {
    __assert_fail("loaded_kbm.last_note == 127",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x17,"int main(int, char **)");
  }
  if (loaded_kbm.first_note != 0x3c) {
    __assert_fail("loaded_kbm.middle_note == 60",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x18,"int main(int, char **)");
  }
  if (loaded_kbm.last_note != 0x45) {
    __assert_fail("loaded_kbm.reference_note == 69",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x19,"int main(int, char **)");
  }
  if (((double)i == 440.0) && (!NAN((double)i))) {
    if (loaded_kbm.middle_note != 0xc) {
      __assert_fail("loaded_kbm.octave_degree == 12",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                    ,0x1b,"int main(int, char **)");
    }
    local_270 = 0;
    do {
      if (0xb < local_270) {
        std::ifstream::close();
        scala::kbm::~kbm((kbm *)&i);
        std::ifstream::~ifstream(local_220);
        return 0;
      }
      if ((local_270 & 1) == 0) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&loaded_kbm.reference_note,
                            local_270);
        if ((long)*pvVar1 != local_270) {
          __assert_fail("loaded_kbm.mapping[i] == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                        ,0x1f,"int main(int, char **)");
        }
      }
      else {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&loaded_kbm.reference_note,
                            local_270);
        if (*pvVar1 != -1) {
          __assert_fail("loaded_kbm.mapping[i] == KBM_NON_ENTRY",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                        ,0x21,"int main(int, char **)");
        }
      }
      local_270 = local_270 + 1;
    } while( true );
  }
  __assert_fail("loaded_kbm.reference_frequency == 440.0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                ,0x1a,"int main(int, char **)");
}

Assistant:

int main(int, char**) {
  ifstream test_kbm; 
  test_kbm.open("kbm/12-tet-xs.kbm");
  scala::kbm loaded_kbm = scala::read_kbm(test_kbm);

  /*
    This test ensures that x's are honored in the KBM 
    file.
  */

  assert(loaded_kbm.map_size == 12);
  assert(loaded_kbm.first_note == 0);
  assert(loaded_kbm.last_note == 127);
  assert(loaded_kbm.middle_note == 60);
  assert(loaded_kbm.reference_note == 69);
  assert(loaded_kbm.reference_frequency == 440.0);
  assert(loaded_kbm.octave_degree == 12);

  for (size_t i = 0; i < 12; i++){
    if (i % 2 == 0){
      assert(loaded_kbm.mapping[i] == i);
    } else {
      assert(loaded_kbm.mapping[i] == KBM_NON_ENTRY);
    }
  }

  test_kbm.close();
  return 0;
}